

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_ErrorList.cpp
# Opt level: O3

ostream * amrex::operator<<(ostream *os,ErrorList *elst)

{
  char *__s;
  undefined8 in_RAX;
  long lVar1;
  ostream *poVar2;
  size_t sVar3;
  long lVar4;
  undefined8 uStack_38;
  
  lVar1 = *(long *)elst;
  if (0 < (int)((ulong)(*(long *)(elst + 8) - lVar1) >> 3)) {
    lVar4 = 0;
    uStack_38 = in_RAX;
    do {
      lVar1 = *(long *)(lVar1 + lVar4 * 8);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         (os,*(char **)(lVar1 + 8),*(long *)(lVar1 + 0x10));
      uStack_38._0_6_ = CONCAT15(0x20,(undefined5)uStack_38);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar2,(char *)((long)&uStack_38 + 5),1);
      poVar2 = (ostream *)
               std::ostream::operator<<
                         (poVar2,*(int *)(*(long *)(*(long *)elst + lVar4 * 8) + 0x28));
      uStack_38._0_7_ = CONCAT16(0x20,(undefined6)uStack_38);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar2,(char *)((long)&uStack_38 + 6),1);
      __s = *(char **)(err_name + (ulong)*(uint *)(*(long *)(*(long *)elst + lVar4 * 8) + 0x2c) * 8)
      ;
      sVar3 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,__s,sVar3);
      uStack_38 = CONCAT17(10,(undefined7)uStack_38);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)((long)&uStack_38 + 7),1);
      lVar4 = lVar4 + 1;
      lVar1 = *(long *)elst;
    } while (lVar4 < (int)((ulong)(*(long *)(elst + 8) - lVar1) >> 3));
  }
  return os;
}

Assistant:

std::ostream&
operator << (std::ostream&    os,
             const ErrorList& elst)
{
    for (int i = 0; i < elst.size(); i++)
    {
        os << elst[i].name()
           << ' '
           << elst[i].nGrow()
           << ' '
           << err_name[elst[i].errType()]
           << '\n';
    }
    return os;
}